

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O0

string * __thiscall
cmLinkLineComputer::ConvertToLinkReference
          (string *__return_storage_ptr__,cmLinkLineComputer *this,string *lib)

{
  bool bVar1;
  string *psVar2;
  string local_58;
  undefined1 local_21;
  string *local_20;
  string *lib_local;
  cmLinkLineComputer *this_local;
  string *relLib;
  
  local_21 = 0;
  local_20 = lib;
  lib_local = (string *)this;
  this_local = (cmLinkLineComputer *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)lib);
  psVar2 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&this->StateDir);
  bVar1 = cmStateDirectory::ContainsBoth(&this->StateDir,psVar2,local_20);
  if (bVar1) {
    psVar2 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&this->StateDir);
    cmSystemTools::ForceToRelativePath(&local_58,psVar2,local_20);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ConvertToLinkReference(
  std::string const& lib) const
{
  std::string relLib = lib;

  if (this->StateDir.ContainsBoth(this->StateDir.GetCurrentBinary(), lib)) {
    relLib = cmSystemTools::ForceToRelativePath(
      this->StateDir.GetCurrentBinary(), lib);
  }
  return relLib;
}